

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderArrow(ImDrawList *draw_list,ImVec2 pos,ImU32 col,ImGuiDir dir,float scale)

{
  uint in_EDX;
  long in_RDI;
  float in_XMM1_Da;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 center;
  float r;
  float h;
  ImVec2 *in_stack_fffffffffffffed8;
  ImVec2 *lhs;
  ImU32 col_00;
  ImVec2 *in_stack_fffffffffffffee8;
  ImVec2 *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  ImDrawList *in_stack_ffffffffffffff00;
  undefined1 local_b0 [24];
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_34;
  ImVec2 local_2c;
  float local_24;
  float local_20;
  uint local_18;
  undefined8 local_10;
  
  local_20 = *(float *)(*(long *)(in_RDI + 0x38) + 0x10);
  local_24 = local_20 * 0.4 * in_XMM1_Da;
  local_18 = in_EDX;
  local_10 = in_RDI;
  ImVec2::ImVec2(&local_34,local_20 * 0.5,local_20 * 0.5 * in_XMM1_Da);
  local_2c = ::operator+(in_stack_fffffffffffffed8,(ImVec2 *)0x4daf1d);
  ImVec2::ImVec2(&local_40);
  ImVec2::ImVec2(&local_48);
  ImVec2::ImVec2(&local_50);
  if (local_18 != 0xffffffff) {
    if (local_18 < 2) {
      if (local_18 == 0) {
        local_24 = -local_24;
      }
      in_stack_fffffffffffffee8 = &local_90;
      ImVec2::ImVec2(in_stack_fffffffffffffee8,0.75,0.0);
      local_88 = ::operator*(in_stack_fffffffffffffed8,0.0);
      in_stack_fffffffffffffef0 = (ImVec2 *)(local_b0 + 0x10);
      in_stack_fffffffffffffefc = -0.75;
      local_40 = local_88;
      ImVec2::ImVec2(in_stack_fffffffffffffef0,-0.75,0.866);
      local_98 = ::operator*(in_stack_fffffffffffffed8,0.0);
      in_stack_ffffffffffffff00 = (ImDrawList *)local_b0;
      local_48 = local_98;
      ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,-0.866);
      local_b0._8_8_ = ::operator*(in_stack_fffffffffffffed8,0.0);
      local_50 = (ImVec2)local_b0._8_8_;
    }
    else if (local_18 - 2 < 2) {
      if (local_18 == 2) {
        local_24 = -local_24;
      }
      ImVec2::ImVec2(&local_60,0.0,0.75);
      local_58 = ::operator*(in_stack_fffffffffffffed8,0.0);
      local_40 = local_58;
      ImVec2::ImVec2(&local_70,-0.866,-0.75);
      local_68 = ::operator*(in_stack_fffffffffffffed8,0.0);
      local_48 = local_68;
      ImVec2::ImVec2(&local_80,0.866,-0.75);
      local_78 = ::operator*(in_stack_fffffffffffffed8,0.0);
      local_50 = local_78;
    }
  }
  lhs = &local_2c;
  col_00 = local_10._4_4_;
  ::operator+(lhs,(ImVec2 *)0x4db1e5);
  ::operator+(lhs,(ImVec2 *)0x4db1fc);
  ::operator+(lhs,(ImVec2 *)0x4db213);
  ImDrawList::AddTriangleFilled
            (in_stack_ffffffffffffff00,
             (ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,col_00);
  return;
}

Assistant:

void ImGui::RenderArrow(ImDrawList* draw_list, ImVec2 pos, ImU32 col, ImGuiDir dir, float scale)
{
    const float h = draw_list->_Data->FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = pos + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        a = ImVec2(+0.000f, +0.750f) * r;
        b = ImVec2(-0.866f, -0.750f) * r;
        c = ImVec2(+0.866f, -0.750f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        a = ImVec2(+0.750f, +0.000f) * r;
        b = ImVec2(-0.750f, +0.866f) * r;
        c = ImVec2(-0.750f, -0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }
    draw_list->AddTriangleFilled(center + a, center + b, center + c, col);
}